

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utLimitBoneWeights.cpp
# Opt level: O2

void __thiscall
LimitBoneWeightsTest_testProcess_Test::TestBody(LimitBoneWeightsTest_testProcess_Test *this)

{
  vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
  *__s;
  aiBone *paVar1;
  aiVertexWeight *paVar2;
  ulong *puVar3;
  ulong *puVar4;
  pointer pWVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  char *pcVar9;
  uint i_1;
  vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
  *this_00;
  uint q;
  ulong uVar10;
  aiMesh *paVar11;
  uint i;
  AssertionResult gtest_ar;
  float fSum;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  LimitBoneWeightsTest_testProcess_Test *local_40;
  ulong *local_38;
  
  Assimp::LimitBoneWeightsProcess::ProcessMesh
            ((this->super_LimitBoneWeightsTest).mProcess,(this->super_LimitBoneWeightsTest).mMesh);
  paVar11 = (this->super_LimitBoneWeightsTest).mMesh;
  uVar8 = paVar11->mNumVertices;
  lVar6 = (ulong)uVar8 * 0x18;
  local_40 = this;
  puVar4 = (ulong *)operator_new__(lVar6 + 8);
  *puVar4 = (ulong)uVar8;
  __s = (vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
         *)(puVar4 + 1);
  local_38 = puVar4;
  if (uVar8 != 0) {
    uVar7 = lVar6 - 0x18;
    memset(__s,0,(uVar7 - uVar7 % 0x18) + 0x18);
  }
  this_00 = __s;
  for (uVar7 = 0; uVar7 < uVar8; uVar7 = uVar7 + 1) {
    std::
    vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
    ::reserve(this_00,4);
    paVar11 = (local_40->super_LimitBoneWeightsTest).mMesh;
    uVar8 = paVar11->mNumVertices;
    this_00 = this_00 + 1;
  }
  for (uVar7 = 0; uVar7 < paVar11->mNumBones; uVar7 = uVar7 + 1) {
    paVar1 = paVar11->mBones[uVar7];
    for (uVar10 = 0; uVar10 < paVar1->mNumWeights; uVar10 = uVar10 + 1) {
      paVar2 = paVar1->mWeights;
      gtest_ar._4_4_ = paVar2[uVar10].mWeight;
      gtest_ar._0_4_ = SUB84(uVar7,0);
      std::
      vector<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
      ::emplace_back<Assimp::LimitBoneWeightsProcess::Weight>
                (__s + paVar2[uVar10].mVertexId,(Weight *)&gtest_ar);
    }
    paVar11 = (local_40->super_LimitBoneWeightsTest).mMesh;
  }
  for (uVar7 = 0; puVar3 = local_38, uVar7 < paVar11->mNumVertices; uVar7 = uVar7 + 1) {
    local_50.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)(puVar4[uVar7 * 3 + 2] -
                (long)__s[uVar7].
                      super__Vector_base<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
                      ._M_impl.super__Vector_impl_data._M_start) >> 3);
    local_48.data_._0_4_ = 4;
    testing::internal::CmpHelperLE<unsigned_long,unsigned_int>
              ((internal *)&gtest_ar,"asWeights[i].size()","4U",(unsigned_long *)&local_50,
               (uint *)&local_48);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_50);
      pcVar9 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utLimitBoneWeights.cpp"
                 ,0x7d,pcVar9);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_50);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    fSum = 0.0;
    for (pWVar5 = __s[uVar7].
                  super__Vector_base<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pWVar5 != __s[uVar7].
                  super__Vector_base<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pWVar5 = pWVar5 + 1) {
      fSum = fSum + pWVar5->mWeight;
    }
    local_50.ptr_._0_4_ = 0x3f733333;
    testing::internal::CmpHelperGE<float,float>
              ((internal *)&gtest_ar,"fSum","0.95F",&fSum,(float *)&local_50);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_50);
      pcVar9 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utLimitBoneWeights.cpp"
                 ,0x82,pcVar9);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_50);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_50.ptr_._0_4_ = 0x3f851eb8;
    testing::internal::CmpHelperLE<float,float>
              ((internal *)&gtest_ar,"fSum","1.04F",&fSum,(float *)&local_50);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_50);
      pcVar9 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utLimitBoneWeights.cpp"
                 ,0x83,pcVar9);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_50);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    paVar11 = (local_40->super_LimitBoneWeightsTest).mMesh;
  }
  if (*local_38 != 0) {
    lVar6 = *local_38 * 0x18;
    do {
      std::
      _Vector_base<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
      ::~_Vector_base((_Vector_base<Assimp::LimitBoneWeightsProcess::Weight,_std::allocator<Assimp::LimitBoneWeightsProcess::Weight>_>
                       *)((long)puVar3 + lVar6 + -0x10));
      lVar6 = lVar6 + -0x18;
    } while (lVar6 != 0);
  }
  operator_delete__(puVar3);
  return;
}

Assistant:

TEST_F(LimitBoneWeightsTest, testProcess) {
    // execute the step on the given data
    mProcess->ProcessMesh(mMesh);

    // check whether everything is ok ...
    typedef std::vector<LimitBoneWeightsProcess::Weight> VertexWeightList;
    VertexWeightList* asWeights = new VertexWeightList[mMesh->mNumVertices];

    for (unsigned int i = 0; i < mMesh->mNumVertices; ++i) {
        asWeights[i].reserve(4);
    }

    // sort back as per-vertex lists
    for (unsigned int i = 0; i < mMesh->mNumBones;++i) {
        aiBone& pcBone = **(mMesh->mBones+i);
        for (unsigned int q = 0; q < pcBone.mNumWeights;++q) {
            aiVertexWeight weight = pcBone.mWeights[q];
            asWeights[weight.mVertexId].push_back(LimitBoneWeightsProcess::Weight (i,weight.mWeight));
        }
    }

    // now validate the size of the lists and check whether all weights sum to 1.0f
    for (unsigned int i = 0; i < mMesh->mNumVertices;++i) {
        EXPECT_LE(asWeights[i].size(), 4U);
        float fSum = 0.0f;
        for (VertexWeightList::const_iterator iter =  asWeights[i].begin(); iter != asWeights[i].end();++iter) {
            fSum += (*iter).mWeight;
        }
        EXPECT_GE(fSum, 0.95F);
        EXPECT_LE(fSum, 1.04F);
    }

    // delete allocated storage
    delete[] asWeights;

    // everything seems to be OK
}